

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::SharedMemoryArbiterImpl::BindToProducerEndpoint
          (SharedMemoryArbiterImpl *this,ProducerEndpoint *producer_endpoint,TaskRunner *task_runner
          )

{
  mutex *__mutex;
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  char *pcVar6;
  uint *puVar7;
  char *pcVar8;
  function<void_()> flush_callback;
  _Any_data local_88;
  code *local_78;
  undefined8 uStack_70;
  _Any_data local_68;
  code *local_58;
  _Any_data local_48;
  code *local_38;
  
  local_78 = (code *)0x0;
  uStack_70 = 0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  __mutex = &this->lock_;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 != 0) {
    ::std::__throw_system_error(iVar4);
  }
  if (this->fully_bound_ == true) {
    pcVar6 = base::Basename(
                           "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                           );
    puVar7 = (uint *)__errno_location();
    uVar1 = *puVar7;
    pcVar8 = strerror(uVar1);
    base::LogMessage(kLogError,pcVar6,0x97d4,"%s (errno: %d, %s)","PERFETTO_CHECK(!fully_bound_)",
                     (ulong)uVar1,pcVar8);
  }
  else if (this->task_runner_ == (TaskRunner *)0x0 &&
           this->producer_endpoint_ == (ProducerEndpoint *)0x0) {
    this->producer_endpoint_ = producer_endpoint;
    this->task_runner_ = task_runner;
    base::WeakPtrFactory<perfetto::SharedMemoryArbiterImpl>::Reset(&this->weak_ptr_factory_,this);
    p_Var5 = (this->pending_writers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      if ((_Rb_tree_header *)p_Var5 == &(this->pending_writers_)._M_t._M_impl.super__Rb_tree_header)
      {
        bVar3 = UpdateFullyBoundLocked(this);
        if (bVar3) {
          TakePendingFlushCallbacksLocked((function<void_()> *)&local_48,this);
          std::function<void_()>::operator=
                    ((function<void_()> *)&local_88,(function<void_()> *)&local_48);
          if (local_38 != (code *)0x0) {
            (*local_38)(&local_48,&local_48,__destroy_functor);
          }
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          if (bVar3) {
            ::std::function<void_()>::function
                      ((function<void_()> *)&local_68,(function<void_()> *)&local_88);
            (*(this->super_SharedMemoryArbiter)._vptr_SharedMemoryArbiter[0xb])(this,&local_68);
            if (local_58 != (code *)0x0) {
              (*local_58)(&local_68,&local_68,__destroy_functor);
            }
          }
        }
        else {
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        if (local_78 != (code *)0x0) {
          (*local_78)((_Any_data *)&local_88,(_Any_data *)&local_88,__destroy_functor);
        }
        return;
      }
      if (*(uint *)&p_Var5[1].field_0x4 < 0x10000) break;
      p_Var5 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var5);
    }
    pcVar6 = base::Basename(
                           "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                           );
    puVar7 = (uint *)__errno_location();
    uVar1 = *puVar7;
    pcVar8 = strerror(uVar1);
    base::LogMessage(kLogError,pcVar6,0x97e3,"%s (errno: %d, %s)",
                     "PERFETTO_CHECK(IsReservationTargetBufferId(entry.second))",(ulong)uVar1,pcVar8
                    );
  }
  else {
    pcVar6 = base::Basename(
                           "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                           );
    puVar7 = (uint *)__errno_location();
    uVar1 = *puVar7;
    pcVar8 = strerror(uVar1);
    base::LogMessage(kLogError,pcVar6,0x97d5,"%s (errno: %d, %s)",
                     "PERFETTO_CHECK(!producer_endpoint_ && !task_runner_)",(ulong)uVar1,pcVar8);
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void SharedMemoryArbiterImpl::BindToProducerEndpoint(
    TracingService::ProducerEndpoint* producer_endpoint,
    base::TaskRunner* task_runner) {
  PERFETTO_DCHECK(producer_endpoint && task_runner);
  PERFETTO_DCHECK(task_runner->RunsTasksOnCurrentThread());

  bool should_flush = false;
  std::function<void()> flush_callback;
  {
    std::lock_guard<std::mutex> scoped_lock(lock_);
    PERFETTO_CHECK(!fully_bound_);
    PERFETTO_CHECK(!producer_endpoint_ && !task_runner_);

    producer_endpoint_ = producer_endpoint;
    task_runner_ = task_runner;

    // Now that we're bound to a task runner, also reset the WeakPtrFactory to
    // it. Because this code runs on the task runner, the factory's weak
    // pointers will be valid on it.
    weak_ptr_factory_.Reset(this);

    // All writers registered so far should be startup trace writers, since
    // the producer cannot feasibly know the target buffer for any future
    // session yet.
    for (const auto& entry : pending_writers_) {
      PERFETTO_CHECK(IsReservationTargetBufferId(entry.second));
    }

    // If all buffer reservations are bound, we can flush pending commits.
    if (UpdateFullyBoundLocked()) {
      should_flush = true;
      flush_callback = TakePendingFlushCallbacksLocked();
    }
  }  // scoped_lock

  // Attempt to flush any pending commits (and run pending flush callbacks). If
  // there are none, this will have no effect. If we ended up in a race that
  // changed |fully_bound_| back to false, the commit will happen once we become
  // |fully_bound_| again.
  if (should_flush)
    FlushPendingCommitDataRequests(flush_callback);
}